

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_robust_access_pass.cpp
# Opt level: O2

Instruction * __thiscall
spvtools::opt::GraphicsRobustAccessPass::InsertInst
          (GraphicsRobustAccessPass *this,Instruction *where_inst,Op opcode,uint32_t type_id,
          uint32_t result_id,OperandList *operands)

{
  Instruction *inst;
  DefUseManager *this_00;
  BasicBlock *block;
  uint32_t local_3c;
  uint32_t local_38;
  Op local_34;
  IRContext *local_30;
  long *local_28;
  
  (this->super_Pass).field_0x34 = 1;
  local_30 = (this->super_Pass).context_;
  local_3c = result_id;
  local_38 = type_id;
  local_34 = opcode;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op&,unsigned_int&,unsigned_int&,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>const&>
            ((spvtools *)&local_28,&local_30,&local_34,&local_38,&local_3c,operands);
  inst = Instruction::InsertBefore
                   (where_inst,
                    (unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&local_28);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  this_00 = IRContext::get_def_use_mgr((this->super_Pass).context_);
  analysis::DefUseManager::AnalyzeInstDefUse(this_00,inst);
  block = IRContext::get_instr_block((this->super_Pass).context_,where_inst);
  IRContext::set_instr_block((this->super_Pass).context_,inst,block);
  return inst;
}

Assistant:

opt::Instruction* GraphicsRobustAccessPass::InsertInst(
    opt::Instruction* where_inst, spv::Op opcode, uint32_t type_id,
    uint32_t result_id, const Instruction::OperandList& operands) {
  module_status_.modified = true;
  auto* result = where_inst->InsertBefore(
      MakeUnique<Instruction>(context(), opcode, type_id, result_id, operands));
  context()->get_def_use_mgr()->AnalyzeInstDefUse(result);
  auto* basic_block = context()->get_instr_block(where_inst);
  context()->set_instr_block(result, basic_block);
  return result;
}